

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateFieldDocComment
               (Printer *printer,FieldDescriptor *field,int is_descriptor,int function_type)

{
  int in_ECX;
  FieldDescriptor *in_RDI;
  string *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  Printer *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  Printer *in_stack_ffffffffffffff70;
  FieldDescriptor *in_stack_ffffffffffffff88;
  Printer *in_stack_ffffffffffffff90;
  string local_58 [15];
  undefined1 in_stack_ffffffffffffffb7;
  FieldDescriptor *in_stack_ffffffffffffffb8;
  string local_38 [15];
  undefined1 in_stack_ffffffffffffffd7;
  FieldDescriptor *in_stack_ffffffffffffffd8;
  
  io::Printer::Print<>(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
  GenerateDocCommentBody<google::protobuf::FieldDescriptor>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  FieldDescriptor::DebugString_abi_cxx11_(in_RDI);
  FirstLineOf(in_stack_ffffffffffffff38);
  EscapePhpdoc(in_stack_ffffffffffffff48);
  io::Printer::Print<char[4],std::__cxx11::string>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             &in_stack_ffffffffffffff60->variable_delimiter_,in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  if (in_ECX == 1) {
    PhpSetterTypeName_abi_cxx11_(in_stack_ffffffffffffffd8,(bool)in_stack_ffffffffffffffd7);
    io::Printer::Print<char[9],std::__cxx11::string>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               &in_stack_ffffffffffffff60->variable_delimiter_,in_stack_ffffffffffffff58);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
    io::Printer::Print<>(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
  }
  else if (in_ECX == 2) {
    PhpGetterTypeName_abi_cxx11_(in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffb7);
    io::Printer::Print<char[9],std::__cxx11::string>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               &in_stack_ffffffffffffff60->variable_delimiter_,in_stack_ffffffffffffff58);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
  }
  io::Printer::Print<>(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
  return;
}

Assistant:

void GenerateFieldDocComment(io::Printer* printer, const FieldDescriptor* field,
                             int is_descriptor, int function_type) {
  // In theory we should have slightly different comments for setters, getters,
  // etc., but in practice everyone already knows the difference between these
  // so it's redundant information.

  // We start the comment with the main body based on the comments from the
  // .proto file (if present). We then end with the field declaration, e.g.:
  //   optional string foo = 5;
  // If the field is a group, the debug string might end with {.
  printer->Print("/**\n");
  GenerateDocCommentBody(printer, field);
  printer->Print(
    " * Generated from protobuf field <code>^def^</code>\n",
    "def", EscapePhpdoc(FirstLineOf(field->DebugString())));
  if (function_type == kFieldSetter) {
    printer->Print(" * @param ^php_type^ $var\n",
      "php_type", PhpSetterTypeName(field, is_descriptor));
    printer->Print(" * @return $this\n");
  } else if (function_type == kFieldGetter) {
    printer->Print(" * @return ^php_type^\n",
      "php_type", PhpGetterTypeName(field, is_descriptor));
  }
  printer->Print(" */\n");
}